

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionarySGL.hpp
# Opt level: O0

void __thiscall ddd::DictionarySGL<false,_true>::DictionarySGL(DictionarySGL<false,_true> *this)

{
  Dictionary *in_RDI;
  unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
  *in_stack_ffffffffffffffc8;
  unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
  *this_00;
  
  Dictionary::Dictionary(in_RDI);
  in_RDI->_vptr_Dictionary = (_func_int **)&PTR__DictionarySGL_001a27b8;
  this_00 = (unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
             *)(in_RDI + 1);
  std::unique_ptr<ddd::DaTrie<false,true,false>,std::default_delete<ddd::DaTrie<false,true,false>>>
  ::unique_ptr<std::default_delete<ddd::DaTrie<false,true,false>>,void>(this_00);
  in_RDI[2]._vptr_Dictionary = (_func_int **)0x0;
  make_unique<ddd::DaTrie<false,true,false>>();
  std::
  unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
  ::operator=(this_00,in_stack_ffffffffffffffc8);
  std::
  unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
  ::~unique_ptr(this_00);
  return;
}

Assistant:

DictionarySGL() {
    trie_ = make_unique<TrieType>();
  }